

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

void __thiscall
StackArgWithFormalsTracker::SetFormalsArraySyms(StackArgWithFormalsTracker *this,SymID symId)

{
  JitArenaAllocator *pJVar1;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  
  this_00 = this->formalsArraySyms;
  if (this_00 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    this_00 = (BVSparse<Memory::JitArenaAllocator> *)
              new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3d6ef4);
    pJVar1 = this->alloc;
    this_00->head = (Type_conflict)0x0;
    this_00->lastFoundIndex = (Type_conflict)0x0;
    this_00->alloc = pJVar1;
    this_00->lastUsedNodePrevNextField = (Type)this_00;
    this->formalsArraySyms = this_00;
  }
  BVSparse<Memory::JitArenaAllocator>::Set(this_00,symId);
  return;
}

Assistant:

void
StackArgWithFormalsTracker::SetFormalsArraySyms(SymID symId)
{
    if (formalsArraySyms == nullptr)
    {
        formalsArraySyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    }
    formalsArraySyms->Set(symId);
}